

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O1

void pgi::randomize_nodes_with_steps_remaining(uint steps,PolicyGraph *g,PRNG *rng)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> avoid_same_policy;
  reference qp;
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  __begin1;
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  __end1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  integer_iterator<unsigned_long> local_120;
  pair<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  local_118;
  filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_b8;
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  local_88;
  
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  vertices_with_steps_remaining(&local_118,steps,g);
  boost::
  iterator_range<boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>>
  ::
  iterator_range<std::pair<boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>,boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>>>
            ((iterator_range<boost::iterators::filter_iterator<boost::function<bool(unsigned_long)>,boost::range_detail::integer_iterator<unsigned_long>>>
              *)&local_88,&local_118);
  boost::function1<bool,_unsigned_long>::~function1
            (&local_118.second.m_predicate.super_function1<bool,_unsigned_long>);
  boost::function1<bool,_unsigned_long>::~function1
            (&local_118.first.m_predicate.super_function1<bool,_unsigned_long>);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin(&local_118.first,&local_88);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>,_boost::iterators::incrementable_traversal_tag>
  ::end(&local_b8,&local_88);
  while (local_118.first.super_type.m_iterator.m_value != local_b8.super_type.m_iterator.m_value) {
    local_120 = local_118.first.super_type.m_iterator.m_value;
    randomize_local_policy(g,(vertex_t)local_118.first.super_type.m_iterator.m_value,rng,&local_138)
    ;
    if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                 (iterator)
                 local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_120.m_value);
    }
    else {
      *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = local_120.m_value;
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_118.first.super_type.m_iterator.m_value =
         (integer_iterator<unsigned_long>)((long)local_118.first.super_type.m_iterator.m_value + 1);
    boost::iterators::
    filter_iterator<boost::function<bool_(unsigned_long)>,_boost::range_detail::integer_iterator<unsigned_long>_>
    ::satisfy_predicate(&local_118.first);
  }
  boost::function1<bool,_unsigned_long>::~function1
            (&local_b8.m_predicate.super_function1<bool,_unsigned_long>);
  boost::function1<bool,_unsigned_long>::~function1
            (&local_118.first.m_predicate.super_function1<bool,_unsigned_long>);
  boost::function1<bool,_unsigned_long>::~function1
            (&local_88.m_End.m_predicate.super_function1<bool,_unsigned_long>);
  boost::function1<bool,_unsigned_long>::~function1
            (&local_88.m_Begin.m_predicate.super_function1<bool,_unsigned_long>);
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void randomize_nodes_with_steps_remaining(unsigned int steps, PolicyGraph& g,
                                          PRNG& rng) {
  std::vector<vertex_t> avoid_same_policy;
  for (auto qp :
       boost::make_iterator_range(vertices_with_steps_remaining(steps, g))) {
    randomize_local_policy(g, qp, rng, avoid_same_policy);
    avoid_same_policy.push_back(qp);
  }
}